

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_ipairs(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef *pTVar2;
  int iVar3;
  TRef TVar4;
  
  uVar1 = *J->base;
  iVar3 = recff_metacall(J,rd,MM_ipairs);
  if ((uVar1 & 0x1f000000) == 0xb000000 && iVar3 == 0) {
    TVar4 = lj_ir_kgc(J,(GCobj *)(ulong)(J->fn->c).upvalue[0].u32.lo,IRT_FUNC);
    pTVar2 = J->base;
    *pTVar2 = TVar4;
    pTVar2[1] = uVar1;
    TVar4 = lj_ir_kint(J,0);
    J->base[2] = TVar4;
    rd->nres = 3;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_ipairs(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (!((LJ_52 || (LJ_HASFFI && tref_iscdata(tr))) &&
	recff_metacall(J, rd, MM_ipairs))) {
    if (tref_istab(tr)) {
      J->base[0] = lj_ir_kfunc(J, funcV(&J->fn->c.upvalue[0]));
      J->base[1] = tr;
      J->base[2] = lj_ir_kint(J, 0);
      rd->nres = 3;
    }  /* else: Interpreter will throw. */
  }
}